

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osmutex.cpp
# Opt level: O1

CK_RV OSCreateMutex(CK_VOID_PTR_PTR newMutex)

{
  uint uVar1;
  pthread_mutex_t *__mutex;
  CK_RV CVar2;
  
  __mutex = (pthread_mutex_t *)malloc(0x28);
  if (__mutex == (pthread_mutex_t *)0x0) {
    softHSMLog(3,"OSCreateMutex",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/common/osmutex.cpp"
               ,0x35,"Failed to allocate memory for a new mutex");
    CVar2 = 2;
  }
  else {
    uVar1 = pthread_mutex_init(__mutex,(pthread_mutexattr_t *)0x0);
    if (uVar1 == 0) {
      *newMutex = __mutex;
      CVar2 = 0;
    }
    else {
      free(__mutex);
      softHSMLog(3,"OSCreateMutex",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/common/osmutex.cpp"
                 ,0x3f,"Failed to initialise POSIX mutex (0x%08X)",(ulong)uVar1);
      CVar2 = 5;
    }
  }
  return CVar2;
}

Assistant:

CK_RV OSCreateMutex(CK_VOID_PTR_PTR newMutex)
{
	int rv;

	/* Allocate memory */
	pthread_mutex_t* pthreadMutex = (pthread_mutex_t*) malloc(sizeof(pthread_mutex_t));

	if (pthreadMutex == NULL)
	{
		ERROR_MSG("Failed to allocate memory for a new mutex");

		return CKR_HOST_MEMORY;
	}

	/* Initialise the mutex */
	if ((rv = pthread_mutex_init(pthreadMutex, NULL)) != 0)
	{
		free(pthreadMutex);

		ERROR_MSG("Failed to initialise POSIX mutex (0x%08X)", rv);

		return CKR_GENERAL_ERROR;
	}

	*newMutex = pthreadMutex;

	return CKR_OK;
}